

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_sp.c
# Opt level: O0

int16_t WebRtcVad_FindMinimum(VadInstT *self,int16_t feature_value,int channel)

{
  int iVar1;
  int16_t *piVar2;
  int16_t *smallest_values;
  int16_t *age;
  int32_t tmp32;
  int16_t alpha;
  int16_t current_median;
  int offset;
  int position;
  int j;
  int i;
  int channel_local;
  int16_t feature_value_local;
  VadInstT *self_local;
  
  _alpha = 0xffffffff;
  iVar1 = channel << 4;
  age._6_2_ = 0x640;
  age._4_2_ = 0;
  piVar2 = self->low_value_vector + iVar1;
  if (5 < channel) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/common_audio/vad/vad_sp.c"
            ,0x49,"DCHECK failed: (channel) < (kNumChannels)");
    exit(1);
  }
  for (position = 0; position < 0x10; position = position + 1) {
    if (self->index_vector[(long)iVar1 + (long)position] == 100) {
      for (offset = position; offset < 0xf; offset = offset + 1) {
        piVar2[offset] = piVar2[offset + 1];
        self->index_vector[(long)iVar1 + (long)offset] =
             self->index_vector[(long)iVar1 + (long)(offset + 1)];
      }
      self->index_vector[(long)iVar1 + 0xf] = 0x65;
      piVar2[0xf] = 10000;
    }
    else {
      self->index_vector[(long)iVar1 + (long)position] =
           self->index_vector[(long)iVar1 + (long)position] + 1;
    }
  }
  if (feature_value < piVar2[7]) {
    if (feature_value < piVar2[3]) {
      if (feature_value < piVar2[1]) {
        _alpha = (uint)(*piVar2 <= feature_value);
      }
      else if (feature_value < piVar2[2]) {
        _alpha = 2;
      }
      else {
        _alpha = 3;
      }
    }
    else if (feature_value < piVar2[5]) {
      if (feature_value < piVar2[4]) {
        _alpha = 4;
      }
      else {
        _alpha = 5;
      }
    }
    else if (feature_value < piVar2[6]) {
      _alpha = 6;
    }
    else {
      _alpha = 7;
    }
  }
  else if (feature_value < piVar2[0xf]) {
    if (feature_value < piVar2[0xb]) {
      if (feature_value < piVar2[9]) {
        if (feature_value < piVar2[8]) {
          _alpha = 8;
        }
        else {
          _alpha = 9;
        }
      }
      else if (feature_value < piVar2[10]) {
        _alpha = 10;
      }
      else {
        _alpha = 0xb;
      }
    }
    else if (feature_value < piVar2[0xd]) {
      if (feature_value < piVar2[0xc]) {
        _alpha = 0xc;
      }
      else {
        _alpha = 0xd;
      }
    }
    else if (feature_value < piVar2[0xe]) {
      _alpha = 0xe;
    }
    else {
      _alpha = 0xf;
    }
  }
  if (-1 < (int)_alpha) {
    for (position = 0xf; (int)_alpha < position; position = position + -1) {
      piVar2[position] = piVar2[position + -1];
      self->index_vector[(long)iVar1 + (long)position] =
           self->index_vector[(long)iVar1 + (long)(position + -1)];
    }
    piVar2[(int)_alpha] = feature_value;
    self->index_vector[(long)iVar1 + (long)(int)_alpha] = 1;
  }
  if (self->frame_counter < 3) {
    if (0 < self->frame_counter) {
      age._6_2_ = *piVar2;
    }
  }
  else {
    age._6_2_ = piVar2[2];
  }
  if (0 < self->frame_counter) {
    if (age._6_2_ < self->mean_value[channel]) {
      age._4_2_ = 0x1999;
    }
    else {
      age._4_2_ = 0x7eb7;
    }
  }
  self->mean_value[channel] =
       (int16_t)((0x7fff - age._4_2_) * (int)age._6_2_ +
                 (age._4_2_ + 1) * (int)self->mean_value[channel] + 0x4000 >> 0xf);
  return self->mean_value[channel];
}

Assistant:

int16_t WebRtcVad_FindMinimum(VadInstT* self,
                              int16_t feature_value,
                              int channel) {
  int i = 0, j = 0;
  int position = -1;
  // Offset to beginning of the 16 minimum values in memory.
  const int offset = (channel << 4);
  int16_t current_median = 1600;
  int16_t alpha = 0;
  int32_t tmp32 = 0;
  // Pointer to memory for the 16 minimum values and the age of each value of
  // the `channel`.
  int16_t* age = &self->index_vector[offset];
  int16_t* smallest_values = &self->low_value_vector[offset];

  RTC_DCHECK_LT(channel, kNumChannels);

  // Each value in `smallest_values` is getting 1 loop older. Update `age`, and
  // remove old values.
  for (i = 0; i < 16; i++) {
    if (age[i] != 100) {
      age[i]++;
    } else {
      // Too old value. Remove from memory and shift larger values downwards.
      for (j = i; j < 15; j++) {
        smallest_values[j] = smallest_values[j + 1];
        age[j] = age[j + 1];
      }
      age[15] = 101;
      smallest_values[15] = 10000;
    }
  }

  // Check if `feature_value` is smaller than any of the values in
  // `smallest_values`. If so, find the `position` where to insert the new value
  // (`feature_value`).
  if (feature_value < smallest_values[7]) {
    if (feature_value < smallest_values[3]) {
      if (feature_value < smallest_values[1]) {
        if (feature_value < smallest_values[0]) {
          position = 0;
        } else {
          position = 1;
        }
      } else if (feature_value < smallest_values[2]) {
        position = 2;
      } else {
        position = 3;
      }
    } else if (feature_value < smallest_values[5]) {
      if (feature_value < smallest_values[4]) {
        position = 4;
      } else {
        position = 5;
      }
    } else if (feature_value < smallest_values[6]) {
      position = 6;
    } else {
      position = 7;
    }
  } else if (feature_value < smallest_values[15]) {
    if (feature_value < smallest_values[11]) {
      if (feature_value < smallest_values[9]) {
        if (feature_value < smallest_values[8]) {
          position = 8;
        } else {
          position = 9;
        }
      } else if (feature_value < smallest_values[10]) {
        position = 10;
      } else {
        position = 11;
      }
    } else if (feature_value < smallest_values[13]) {
      if (feature_value < smallest_values[12]) {
        position = 12;
      } else {
        position = 13;
      }
    } else if (feature_value < smallest_values[14]) {
      position = 14;
    } else {
      position = 15;
    }
  }

  // If we have detected a new small value, insert it at the correct position
  // and shift larger values up.
  if (position > -1) {
    for (i = 15; i > position; i--) {
      smallest_values[i] = smallest_values[i - 1];
      age[i] = age[i - 1];
    }
    smallest_values[position] = feature_value;
    age[position] = 1;
  }

  // Get `current_median`.
  if (self->frame_counter > 2) {
    current_median = smallest_values[2];
  } else if (self->frame_counter > 0) {
    current_median = smallest_values[0];
  }

  // Smooth the median value.
  if (self->frame_counter > 0) {
    if (current_median < self->mean_value[channel]) {
      alpha = kSmoothingDown;  // 0.2 in Q15.
    } else {
      alpha = kSmoothingUp;  // 0.99 in Q15.
    }
  }
  tmp32 = (alpha + 1) * self->mean_value[channel];
  tmp32 += (WEBRTC_SPL_WORD16_MAX - alpha) * current_median;
  tmp32 += 16384;
  self->mean_value[channel] = (int16_t) (tmp32 >> 15);

  return self->mean_value[channel];
}